

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O3

void __thiscall
FIX::MessageStoreExceptionWrapper::reset
          (MessageStoreExceptionWrapper *this,UtcTimeStamp *now,bool *threw,IOException *ex)

{
  *threw = false;
  (**(code **)(**(long **)this + 0x58))();
  return;
}

Assistant:

void MessageStoreExceptionWrapper::reset(const UtcTimeStamp &now, bool &threw, IOException &ex) {
  threw = false;
  try {
    m_pStore->reset(now);
  } catch (IOException &e) {
    threw = true;
    ex = e;
  }
}